

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_Plugin_TransitiveDeprecatedFeature_Test::TestBody
          (CommandLineInterfaceTest_Plugin_TransitiveDeprecatedFeature_Test *this)

{
  Descriptor *pDVar1;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view contents;
  string_view contents_00;
  string_view contents_01;
  string_view contents_02;
  string local_50;
  string local_30;
  
  pDVar1 = DescriptorProto::GetDescriptor();
  FileDescriptor::DebugString_abi_cxx11_(&local_50,pDVar1->file_);
  name._M_str = "google/protobuf/descriptor.proto";
  name._M_len = 0x20;
  contents._M_str = local_50._M_dataplus._M_p;
  contents._M_len = local_50._M_string_length;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  std::__cxx11::string::~string((string *)&local_50);
  pDVar1 = pb::TestFeatures::GetDescriptor();
  FileDescriptor::DebugString_abi_cxx11_(&local_50,pDVar1->file_);
  name_00._M_str = "google/protobuf/unittest_features.proto";
  name_00._M_len = 0x27;
  contents_00._M_str = local_50._M_dataplus._M_p;
  contents_00._M_len = local_50._M_string_length;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_00,contents_00)
  ;
  std::__cxx11::string::~string((string *)&local_50);
  name_01._M_str = "unused.proto";
  name_01._M_len = 0xc;
  contents_01._M_str =
       "\n    edition = \"2023\";\n    import \"google/protobuf/unittest_features.proto\";\n    package foo;\n    option features.(pb.test).removed_feature = VALUE9;\n    message Foo {}\n  "
  ;
  contents_01._M_len = 0xab;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_01,contents_01)
  ;
  name_02._M_str = "foo.proto";
  name_02._M_len = 9;
  contents_02._M_str =
       "\n    edition = \"2023\";\n    import \"unused.proto\";\n    package foo;\n    message Bar {\n      Foo foo = 1;\n    }\n  "
  ;
  contents_02._M_len = 0x70;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_02,contents_02)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto",
             (allocator<char> *)&local_50);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_TransitiveDeprecatedFeature) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("google/protobuf/unittest_features.proto",
                 pb::TestFeatures::descriptor()->file()->DebugString());
  CreateTempFile("unused.proto",
                 R"schema(
    edition = "2023";
    import "google/protobuf/unittest_features.proto";
    package foo;
    option features.(pb.test).removed_feature = VALUE9;
    message Foo {}
  )schema");
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "unused.proto";
    package foo;
    message Bar {
      Foo foo = 1;
    }
  )schema");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir foo.proto");
  ExpectNoErrors();
}